

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall asl::Socket_::bind(Socket_ *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sockaddr *psVar1;
  char *pcVar2;
  socklen_t __len_00;
  int iVar3;
  undefined4 in_register_00000034;
  InetAddress here;
  InetAddress local_38;
  String local_28;
  
  if (0xffff < (uint)__addr) {
    this->_error = 8;
    return 0;
  }
  InetAddress::InetAddress(&local_38,(String *)CONCAT44(in_register_00000034,__fd),(uint)__addr);
  psVar1 = (sockaddr *)(local_38._data._a + -0x10);
  iVar3._0_2_ = psVar1->sa_family;
  iVar3._2_1_ = psVar1->sa_data[0];
  iVar3._3_1_ = psVar1->sa_data[1];
  if (iVar3 != 0) {
    init(this,(EVP_PKEY_CTX *)(ulong)(this->_family != local_38._type));
    this->_family = local_38._type;
    local_28._size = 1;
    (*(this->super_SmartObject_)._vptr_SmartObject_[3])(this,1,2,&local_28,4);
    psVar1 = (sockaddr *)(local_38._data._a + -0x10);
    __len_00._0_2_ = psVar1->sa_family;
    __len_00._2_1_ = psVar1->sa_data[0];
    __len_00._3_1_ = psVar1->sa_data[1];
    iVar3 = ::bind(*(int *)&(this->super_SmartObject_).field_0xc,(sockaddr *)local_38._data._a,
                   __len_00);
    if (iVar3 == 0) {
      iVar3 = (int)CONCAT71((int7)((ulong)this >> 8),1);
      goto LAB_0011d66c;
    }
    InetAddress::toString(&local_28,&local_38);
    if (local_28._size != 0) {
      free(local_28.field_2._str);
    }
    this->_error = 8;
  }
  iVar3 = 0;
LAB_0011d66c:
  LOCK();
  pcVar2 = (char *)(local_38._data._a + -8);
  *(int *)pcVar2 = *(int *)pcVar2 + -1;
  UNLOCK();
  if (*(int *)pcVar2 == 0) {
    free((sockaddr *)(local_38._data._a + -0x10));
  }
  return iVar3;
}

Assistant:

bool Socket_::bind(const String& ip, int port)
{
	if (port < 0 || port > 65535)
	{
		_error = SOCKET_BAD_BIND;
		return false;
	}

	InetAddress here(ip, port);
	if (here.length() == 0)
		return false;

	init(_family != here.type());
	_family = here.type();
	setOption(SOL_SOCKET, SO_REUSEADDR, 1);

	if(::bind(_handle, (sockaddr*)here.ptr(), here.length()))
	{
		verbose_print("Can't bind to %s\n", *here.toString());
		_error = SOCKET_BAD_BIND;
		return false;
	}
	return true;
}